

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts round_to_int(FloatParts a,int rmode,int scale,float_status *s)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  FloatParts FVar5;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  bool local_8a;
  bool local_89;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_68;
  uint64_t inc;
  uint64_t rnd_mask;
  uint64_t rnd_even_mask;
  uint64_t frac_lsbm1;
  uint64_t frac_lsb;
  _Bool one;
  float_status *s_local;
  int scale_local;
  int rmode_local;
  FloatParts a_local;
  undefined8 local_10;
  
  _scale_local = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_1_ = a.cls;
  a_local.frac._5_1_ = a.sign;
  a_local.frac._6_2_ = a._14_2_;
  uVar1 = a_local.frac._4_1_ - 1;
  if (uVar1 < 4 || a_local.frac._4_1_ == 5) {
    switch((long)&switchD_012bc594::switchdataD_013d02a0 +
           (long)(int)(&switchD_012bc594::switchdataD_013d02a0)[uVar1]) {
    case 0x12bc596:
      FVar5 = return_nan(a,s);
      return FVar5;
    case 0x12bc5b4:
      break;
    case 0x12bc5b9:
      local_74 = scale;
      if (scale < -0xffff) {
        local_74 = -0x10000;
      }
      if (local_74 < 0x10000) {
        local_78 = scale;
        if (scale < -0xffff) {
          local_78 = -0x10000;
        }
        local_7c = local_78;
      }
      else {
        local_7c = 0x10000;
      }
      a_local.frac._0_4_ = local_7c + (int)a_local.frac;
      if ((int)a_local.frac < 0x3e) {
        if ((int)a_local.frac < 0) {
          s->float_exception_flags = s->float_exception_flags | 0x20;
          switch(rmode) {
          case 0:
            local_89 = (int)a_local.frac == -1 && 0x4000000000000000 < _scale_local;
            frac_lsb._7_1_ = local_89;
            break;
          case 1:
            frac_lsb._7_1_ = (bool)(a_local.frac._5_1_ & 1);
            break;
          case 2:
            frac_lsb._7_1_ = (bool)((a_local.frac._5_1_ ^ 0xffU) & 1);
            break;
          case 3:
            frac_lsb._7_1_ = false;
            break;
          case 4:
            local_8a = (int)a_local.frac == -1 && 0x3fffffffffffffff < _scale_local;
            frac_lsb._7_1_ = local_8a;
            break;
          case 5:
            frac_lsb._7_1_ = true;
            break;
          default:
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                       ,0x804,(char *)0x0);
          }
          if (frac_lsb._7_1_ == false) {
            a_local.frac._4_1_ = float_class_zero;
          }
          else {
            _scale_local = 0x4000000000000000;
            a_local.frac._0_4_ = 0;
          }
        }
        else {
          uVar2 = 0x4000000000000000 >> ((byte)a_local.frac & 0x3f);
          local_a0 = uVar2 >> 1;
          uVar3 = uVar2 - 1 | uVar2;
          uVar4 = uVar3 >> 1;
          switch(rmode) {
          case 0:
            if ((_scale_local & uVar3) == local_a0) {
              local_a0 = 0;
            }
            local_68 = local_a0;
            break;
          case 1:
            local_b0 = uVar4;
            if (((undefined1  [16])a & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
              local_b0 = 0;
            }
            local_68 = local_b0;
            break;
          case 2:
            local_a8 = uVar4;
            if (((undefined1  [16])a & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
              local_a8 = 0;
            }
            local_68 = local_a8;
            break;
          case 3:
            local_68 = 0;
            break;
          case 4:
            local_68 = local_a0;
            break;
          case 5:
            local_b8 = uVar4;
            if ((_scale_local & uVar2) != 0) {
              local_b8 = 0;
            }
            local_68 = local_b8;
            break;
          default:
            g_assertion_message_expr
                      ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                       ,0x829,(char *)0x0);
          }
          if ((_scale_local & uVar4) != 0) {
            s->float_exception_flags = s->float_exception_flags | 0x20;
            _scale_local = (uVar4 ^ 0xffffffffffffffff) & local_68 + _scale_local;
            if ((_scale_local & 0x8000000000000000) != 0) {
              _scale_local = _scale_local >> 1;
              a_local.frac._0_4_ = (int)a_local.frac + 1;
            }
          }
        }
      }
    }
    local_10._4_1_ = a_local.frac._4_1_;
    local_10._0_4_ = (int)a_local.frac;
    local_10._5_1_ = a_local.frac._5_1_;
    local_10._6_2_ = a_local.frac._6_2_;
    a_local.exp = scale_local;
    a_local.cls = (undefined1)rmode_local;
    a_local.sign = (_Bool)rmode_local._1_1_;
    a_local._14_2_ = rmode_local._2_2_;
    return stack0xffffffffffffffe8;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
             ,0x839,(char *)0x0);
}

Assistant:

static FloatParts round_to_int(FloatParts a, int rmode,
                               int scale, float_status *s)
{
    switch (a.cls) {
    case float_class_qnan:
    case float_class_snan:
        return return_nan(a, s);

    case float_class_zero:
    case float_class_inf:
        /* already "integral" */
        break;

    case float_class_normal:
        scale = MIN(MAX(scale, -0x10000), 0x10000);
        a.exp += scale;

        if (a.exp >= DECOMPOSED_BINARY_POINT) {
            /* already integral */
            break;
        }
        if (a.exp < 0) {
            bool one = false;
            /* all fractional */
            s->float_exception_flags |= float_flag_inexact;
            switch (rmode) {
            case float_round_nearest_even:
                one = a.exp == -1 && a.frac > DECOMPOSED_IMPLICIT_BIT;
                break;
            case float_round_ties_away:
                one = a.exp == -1 && a.frac >= DECOMPOSED_IMPLICIT_BIT;
                break;
            case float_round_to_zero:
                one = false;
                break;
            case float_round_up:
                one = !a.sign;
                break;
            case float_round_down:
                one = a.sign;
                break;
            case float_round_to_odd:
                one = true;
                break;
            default:
                g_assert_not_reached();
                break;
            }

            if (one) {
                a.frac = DECOMPOSED_IMPLICIT_BIT;
                a.exp = 0;
            } else {
                a.cls = float_class_zero;
            }
        } else {
            uint64_t frac_lsb = DECOMPOSED_IMPLICIT_BIT >> a.exp;
            uint64_t frac_lsbm1 = frac_lsb >> 1;
            uint64_t rnd_even_mask = (frac_lsb - 1) | frac_lsb;
            uint64_t rnd_mask = rnd_even_mask >> 1;
            uint64_t inc = 0;

            switch (rmode) {
            case float_round_nearest_even:
                inc = ((a.frac & rnd_even_mask) != frac_lsbm1 ? frac_lsbm1 : 0);
                break;
            case float_round_ties_away:
                inc = frac_lsbm1;
                break;
            case float_round_to_zero:
                inc = 0;
                break;
            case float_round_up:
                inc = a.sign ? 0 : rnd_mask;
                break;
            case float_round_down:
                inc = a.sign ? rnd_mask : 0;
                break;
            case float_round_to_odd:
                inc = a.frac & frac_lsb ? 0 : rnd_mask;
                break;
            default:
                g_assert_not_reached();
                break;
            }

            if (a.frac & rnd_mask) {
                s->float_exception_flags |= float_flag_inexact;
                a.frac += inc;
                a.frac &= ~rnd_mask;
                if (a.frac & DECOMPOSED_OVERFLOW_BIT) {
                    a.frac >>= 1;
                    a.exp++;
                }
            }
        }
        break;
    default:
        g_assert_not_reached();
    }
    return a;
}